

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O2

void __thiscall Js::StackScriptFunction::BoxState::Box(BoxState *this)

{
  NestedArray *pNVar1;
  FunctionProxy *this_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  LocalFunctionId functionId;
  int iVar6;
  InterpreterStackFrame *pIVar7;
  undefined4 extraout_var;
  char16 *pcVar8;
  JavascriptFunction *pJVar9;
  FrameDisplay *pFVar10;
  WriteBarrierPtr<void> *pWVar11;
  Type *pTVar12;
  FunctionInfo *pFVar13;
  FunctionBody *pFVar14;
  StackScriptFunction *pSVar15;
  ScriptFunction *pSVar16;
  void **ppvVar17;
  IRecyclerVisitedObject IVar18;
  uint i;
  char16_t *pcVar19;
  InterpreterStackFrame IVar20;
  uint i_2;
  uint uVar21;
  WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> local_168;
  char16 debugStringBuffer [42];
  JavascriptStackWalker walker;
  JavascriptFunction *local_60;
  JavascriptFunction *caller;
  uint local_4c;
  undefined4 *local_48;
  uint local_3c;
  FunctionBody *local_38;
  
  local_3c = 0;
  JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)(debugStringBuffer + 0x28),this->scriptContext,true,
             this->returnAddress,false);
  local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    do {
      BVar4 = JavascriptStackWalker::GetCaller
                        ((JavascriptStackWalker *)(debugStringBuffer + 0x28),&local_60,true);
      if (BVar4 == 0) {
        if ((local_3c & 1) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_48 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                      ,400,"(!hasInlineeToBox)","!hasInlineeToBox");
          if (!bVar3) {
LAB_00bedd9e:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *local_48 = 0;
        }
        Finish(this);
        JavascriptStackWalker::~JavascriptStackWalker
                  ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
        return;
      }
      BVar4 = JavascriptFunction::IsScriptFunction(local_60);
    } while (BVar4 == 0);
    caller = (JavascriptFunction *)VarTo<Js::ScriptFunction,Js::JavascriptFunction>(local_60);
    local_38 = JavascriptFunction::GetFunctionBody(caller);
    if (((local_3c & 1) != 0) || (bVar3 = NeedBoxFrame(this,local_38), bVar3)) {
      pIVar7 = JavascriptStackWalker::GetCurrentInterpreterFrame
                         ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
      bVar3 = NeedBoxFrame(this,local_38);
      local_4c = local_3c & 0xff;
      if (bVar3) {
        if (pIVar7 == (InterpreterStackFrame *)0x0) {
LAB_00bed59f:
          if ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0) {
            bVar3 = NeedBoxFrame(this,local_38);
            pcVar19 = L"Native";
            if ((local_3c & 1) != 0) {
              pcVar19 = L"Native and Inlinee";
            }
            if (!bVar3) {
              pcVar19 = L"Native for Inlinee";
            }
          }
          else {
            bVar3 = NeedBoxFrame(this,local_38);
            pcVar19 = L"Native Inlined (Pending)";
            if (!bVar3) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_48 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                          ,0xb4,"(this->NeedBoxFrame(callerFunctionBody))",
                                          "this->NeedBoxFrame(callerFunctionBody)");
              if (!bVar3) goto LAB_00bedd9e;
              *local_48 = 0;
              pcVar19 = L"Native Inlined (Pending)";
            }
          }
        }
        else {
          if ((local_3c & 1) != 0) {
LAB_00bed619:
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_48 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                        ,0xae,"(!hasInlineeToBox)","!hasInlineeToBox");
            if (!bVar3) goto LAB_00bedd9e;
            *local_48 = 0;
          }
          bVar3 = JavascriptStackWalker::IsBailedOutFromInlinee
                            ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
          pcVar19 = L"Interpreted from Inlined Bailout (Pending)";
          if (!bVar3) {
            bVar3 = JavascriptStackWalker::IsBailedOutFromFunction
                              ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
            pcVar19 = L"Interpreted";
            if (bVar3) {
              pcVar19 = L"Interpreted from Bailout";
            }
          }
        }
        uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)local_38);
        functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)local_38);
        bVar3 = Phases::IsEnabled((Phases *)&DAT_014594b0,StackFuncPhase,uVar5,functionId);
        if (bVar3) {
          iVar6 = (*(local_38->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])();
          pcVar8 = FunctionProxy::GetDebugNumberSet
                             ((FunctionProxy *)local_38,(wchar (*) [42])&local_168);
          Output::Print(L"Boxing Frame [%s]: %s %s\n",pcVar19,CONCAT44(extraout_var,iVar6),pcVar8);
          Output::Flush();
        }
        if (pIVar7 == (InterpreterStackFrame *)0x0) goto LAB_00bed91a;
        if ((local_3c & 1) != 0) goto LAB_00bed739;
LAB_00bed77f:
        pJVar9 = GetCurrentFunctionObject(*(JavascriptFunction **)(pIVar7 + 0x80));
        if (pJVar9 != local_60) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_48 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                      ,0xca,
                                      "(StackScriptFunction::GetCurrentFunctionObject(interpreterFrame->GetJavascriptFunction()) == caller)"
                                      ,
                                      "StackScriptFunction::GetCurrentFunctionObject(interpreterFrame->GetJavascriptFunction()) == caller"
                                     );
          if (!bVar3) goto LAB_00bedd9e;
          *local_48 = 0;
        }
        bVar3 = FunctionBody::DoStackFrameDisplay(local_38);
        if (((bVar3) && (((byte)pIVar7[0xd6] & 1) != 0)) &&
           (pFVar10 = InterpreterStackFrame::GetLocalFrameDisplay(pIVar7),
           pFVar10 != (FrameDisplay *)0x0)) {
          pFVar10 = BoxFrameDisplay(this,pFVar10);
          InterpreterStackFrame::SetLocalFrameDisplay(pIVar7,pFVar10);
        }
        bVar3 = FunctionBody::DoStackScopeSlots(local_38);
        if (((bVar3) && (((byte)pIVar7[0xd6] & 1) != 0)) &&
           (pWVar11 = (WriteBarrierPtr<void> *)InterpreterStackFrame::GetLocalClosure(pIVar7),
           pWVar11 != (WriteBarrierPtr<void> *)0x0)) {
          Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
                    (&local_168,pWVar11);
          pTVar12 = BoxScopeSlots(this,pWVar11,*(uint *)&(local_168.ptr)->ptr);
          InterpreterStackFrame::SetLocalClosure(pIVar7,pTVar12);
        }
        pNVar1 = (local_38->super_ParseableFunctionInfo).nestedArray.ptr;
        uVar21 = 0;
        uVar5 = 0;
        if (pNVar1 != (NestedArray *)0x0) {
          uVar5 = pNVar1->nestedCount;
        }
        for (; uVar5 != uVar21; uVar21 = uVar21 + 1) {
          pSVar15 = InterpreterStackFrame::GetStackNestedFunction(pIVar7,uVar21);
          pSVar16 = BoxStackFunction(this,&pSVar15->super_ScriptFunction);
          if (pSVar15->boxedScriptFunction != pSVar16) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_48 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                        ,0xe9,
                                        "(stackFunction->boxedScriptFunction == boxedFunction)",
                                        "stackFunction->boxedScriptFunction == boxedFunction");
            if (!bVar3) goto LAB_00bedd9e;
            *local_48 = 0;
          }
          UpdateFrameDisplay(this,&pSVar15->super_ScriptFunction);
        }
        bVar3 = JavascriptStackWalker::IsBailedOutFromInlinee
                          ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
        if (!bVar3) {
          bVar3 = JavascriptStackWalker::IsBailedOutFromFunction
                            ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
          if (bVar3) {
            BoxNativeFrame(this,(JavascriptStackWalker *)(debugStringBuffer + 0x28),local_38);
            pNVar1 = (local_38->super_ParseableFunctionInfo).nestedArray.ptr;
            if (((pNVar1 != (NestedArray *)0x0) && (pNVar1->nestedCount != 0)) &&
               ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0)) {
              ppvVar17 = JavascriptStackWalker::GetCurrentArgv
                                   ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
              IVar18._vptr_IRecyclerVisitedObject =
                   *(_func_int ***)
                    ((long)ppvVar17 +
                    ((ulong)((local_38->super_ParseableFunctionInfo).m_inParamCount == 0) << 3 |
                    0xffffffffffffffe0));
              while (IVar18._vptr_IRecyclerVisitedObject != (_func_int **)0x0) {
                pSVar15 = VarTo<Js::StackScriptFunction>(IVar18._vptr_IRecyclerVisitedObject);
                UpdateFrameDisplay(this,&pSVar15->super_ScriptFunction);
                IVar18._vptr_IRecyclerVisitedObject =
                     pSVar15[1].super_ScriptFunction.super_ScriptFunctionBase.
                     super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                     super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject;
              }
            }
          }
          goto LAB_00bedbf5;
        }
        bVar3 = JavascriptStackWalker::IsCurrentPhysicalFrameForLoopBody
                          ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
      }
      else {
        if ((local_3c & 1) != 0) {
          if ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0) {
            if (pIVar7 != (InterpreterStackFrame *)0x0) goto LAB_00bed619;
            goto LAB_00bed59f;
          }
          if (pIVar7 == (InterpreterStackFrame *)0x0) goto LAB_00bed91a;
LAB_00bed739:
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_48 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                      ,200,"(!hasInlineeToBox)","!hasInlineeToBox");
          if (bVar3) {
            *local_48 = 0;
            goto LAB_00bed77f;
          }
          goto LAB_00bedd9e;
        }
        if (pIVar7 != (InterpreterStackFrame *)0x0) goto LAB_00bed77f;
LAB_00bed91a:
        if ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0) {
          pFVar14 = local_38;
          bVar3 = FunctionBody::DoStackFrameDisplay(local_38);
          if ((bVar3) &&
             (pFVar10 = GetFrameDisplayFromNativeFrame
                                  ((BoxState *)pFVar14,
                                   (JavascriptStackWalker *)(debugStringBuffer + 0x28),local_38),
             pFVar10 != (FrameDisplay *)0x0)) {
            BoxFrameDisplay(this,pFVar10);
          }
          pFVar14 = local_38;
          bVar3 = FunctionBody::DoStackScopeSlots(local_38);
          if ((bVar3) &&
             (pWVar11 = (WriteBarrierPtr<void> *)
                        GetScopeSlotsFromNativeFrame
                                  ((BoxState *)pFVar14,
                                   (JavascriptStackWalker *)(debugStringBuffer + 0x28),local_38),
             pWVar11 != (WriteBarrierPtr<void> *)0x0)) {
            Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
                      (&local_168,pWVar11);
            BoxScopeSlots(this,pWVar11,*(uint *)&(local_168.ptr)->ptr);
          }
          BoxNativeFrame(this,(JavascriptStackWalker *)(debugStringBuffer + 0x28),local_38);
          pNVar1 = (local_38->super_ParseableFunctionInfo).nestedArray.ptr;
          if (((pNVar1 != (NestedArray *)0x0) && (pNVar1->nestedCount != 0)) &&
             ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0)) {
            ppvVar17 = JavascriptStackWalker::GetCurrentArgv
                                 ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
            IVar18._vptr_IRecyclerVisitedObject =
                 *(_func_int ***)
                  ((long)ppvVar17 +
                  ((ulong)((local_38->super_ParseableFunctionInfo).m_inParamCount == 0) << 3 |
                  0xffffffffffffffe0));
            if (IVar18._vptr_IRecyclerVisitedObject != (_func_int **)0x0) {
              do {
                pSVar15 = VarTo<Js::StackScriptFunction>(IVar18._vptr_IRecyclerVisitedObject);
                UpdateFrameDisplay(this,&pSVar15->super_ScriptFunction);
                IVar18._vptr_IRecyclerVisitedObject =
                     pSVar15[1].super_ScriptFunction.super_ScriptFunctionBase.
                     super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                     super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject;
                local_3c = 0;
              } while (IVar18._vptr_IRecyclerVisitedObject != (_func_int **)0x0);
              goto LAB_00bedbf5;
            }
          }
          local_3c = 0;
          goto LAB_00bedbf5;
        }
        bVar3 = JavascriptStackWalker::IsCurrentPhysicalFrameForLoopBody
                          ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
      }
      local_3c = local_4c;
      if (bVar3 == false) {
        local_3c = 1;
      }
    }
    else {
      bVar3 = FunctionBody::DoStackFrameDisplay(local_38);
      if ((bVar3) && ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0)) {
        pIVar7 = JavascriptStackWalker::GetCurrentInterpreterFrame
                           ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
        if (pIVar7 == (InterpreterStackFrame *)0x0) {
          ppvVar17 = JavascriptStackWalker::GetCurrentArgv
                               ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
          pFVar10 = (FrameDisplay *)
                    ppvVar17[(ulong)((local_38->super_ParseableFunctionInfo).m_inParamCount == 0) -
                             5];
          IVar20 = (InterpreterStackFrame)0x1;
        }
        else {
          pFVar10 = InterpreterStackFrame::GetLocalFrameDisplay(pIVar7);
          IVar20 = pIVar7[0xd6];
        }
        bVar3 = ThreadContext::IsOnStack(pFVar10);
        if (((byte)IVar20 & bVar3) == 1) {
          for (uVar5 = 0; uVar5 < pFVar10->length; uVar5 = uVar5 + 1) {
            pWVar11 = (WriteBarrierPtr<void> *)FrameDisplay::GetItem(pFVar10,uVar5);
            if ((pWVar11 != (WriteBarrierPtr<void> *)0x0) && (pWVar11->ptr < (void *)0x10000)) {
              Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
                        (&local_168,pWVar11);
              bVar3 = ScopeSlots::IsDebuggerScopeSlotArray((ScopeSlots *)&local_168);
              if (!bVar3) {
                pFVar13 = ScopeSlots::GetFunctionInfo((ScopeSlots *)&local_168);
                this_00 = (pFVar13->functionBodyImpl).ptr;
                bVar3 = FunctionProxy::IsFunctionBody(this_00);
                if (bVar3) {
                  pFVar14 = FunctionProxy::GetFunctionBody(this_00);
                  bVar3 = NeedBoxFrame(this,pFVar14);
                  if (bVar3) break;
                }
              }
            }
          }
          for (; uVar5 < pFVar10->length; uVar5 = uVar5 + 1) {
            pWVar11 = (WriteBarrierPtr<void> *)FrameDisplay::GetItem(pFVar10,uVar5);
            if ((pWVar11 != (WriteBarrierPtr<void> *)0x0) && (pWVar11->ptr < (void *)0x10000)) {
              Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
                        (&local_168,pWVar11);
              pTVar12 = BoxScopeSlots(this,pWVar11,*(uint *)&(local_168.ptr)->ptr);
              FrameDisplay::SetItem(pFVar10,uVar5,pTVar12);
            }
          }
        }
      }
    }
LAB_00bedbf5:
    bVar3 = NeedBoxScriptFunction(this,(ScriptFunction *)caller);
    if ((bVar3) && (bVar3 = ThreadContext::IsOnStack(caller), bVar3)) {
      pSVar15 = VarTo<Js::StackScriptFunction,Js::ScriptFunction>((ScriptFunction *)caller);
      pSVar16 = BoxStackFunction(this,&pSVar15->super_ScriptFunction);
      JavascriptStackWalker::SetCurrentFunction
                ((JavascriptStackWalker *)(debugStringBuffer + 0x28),(JavascriptFunction *)pSVar16);
      pIVar7 = JavascriptStackWalker::GetCurrentInterpreterFrame
                         ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
      if (pIVar7 != (InterpreterStackFrame *)0x0) {
        InterpreterStackFrame::SetExecutingStackFunction(pIVar7,pSVar16);
      }
      pNVar1 = (local_38->super_ParseableFunctionInfo).nestedArray.ptr;
      if (((pNVar1 != (NestedArray *)0x0) && (pNVar1->nestedCount != 0)) &&
         (((local_38->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) != Flags_None)) {
        pIVar7 = JavascriptStackWalker::GetCurrentInterpreterFrame
                           ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
        if (pIVar7 == (InterpreterStackFrame *)0x0) {
          if ((walker.inlinedFrameCallInfo._0_2_ & 1) == 0) {
            ppvVar17 = JavascriptStackWalker::GetCurrentArgv
                                 ((JavascriptStackWalker *)(debugStringBuffer + 0x28));
            IVar18._vptr_IRecyclerVisitedObject =
                 *(_func_int ***)
                  ((long)ppvVar17 +
                  ((ulong)((local_38->super_ParseableFunctionInfo).m_inParamCount == 0) << 3 |
                  0xffffffffffffffe0));
            while (IVar18._vptr_IRecyclerVisitedObject != (_func_int **)0x0) {
              pSVar15 = VarTo<Js::StackScriptFunction>(IVar18._vptr_IRecyclerVisitedObject);
              UpdateFrameDisplay(this,&pSVar15->super_ScriptFunction);
              IVar18._vptr_IRecyclerVisitedObject =
                   pSVar15[1].super_ScriptFunction.super_ScriptFunctionBase.super_JavascriptFunction
                   .super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
            }
          }
        }
        else {
          pNVar1 = (local_38->super_ParseableFunctionInfo).nestedArray.ptr;
          uVar5 = 0;
          uVar21 = 0;
          if (pNVar1 != (NestedArray *)0x0) {
            uVar5 = pNVar1->nestedCount;
            uVar21 = 0;
          }
          for (; uVar5 != uVar21; uVar21 = uVar21 + 1) {
            pSVar15 = InterpreterStackFrame::GetStackNestedFunction(pIVar7,uVar21);
            UpdateFrameDisplay(this,&pSVar15->super_ScriptFunction);
          }
        }
      }
    }
  } while( true );
}

Assistant:

void StackScriptFunction::BoxState::Box()
    {
        JavascriptStackWalker walker(scriptContext, true, returnAddress);
        JavascriptFunction * caller;
        bool hasInlineeToBox = false;
        while (walker.GetCaller(&caller))
        {
            if (!caller->IsScriptFunction())
            {
                continue;
            }

            ScriptFunction * callerScriptFunction = VarTo<ScriptFunction>(caller);
            FunctionBody * callerFunctionBody = callerScriptFunction->GetFunctionBody();
            if (hasInlineeToBox || this->NeedBoxFrame(callerFunctionBody))
            {
                // Box the frame display, but don't need to box the function unless we see them
                // in the slots.

                // If the frame display has any stack nested function, then it must have given to one of the
                // stack functions.  If it doesn't appear in  on eof the stack function , the frame display
                // doesn't contain any stack function
                InterpreterStackFrame * interpreterFrame = walker.GetCurrentInterpreterFrame();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                if (this->NeedBoxFrame(callerFunctionBody) || (hasInlineeToBox && !walker.IsInlineFrame()))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    char16 const * frameKind;
                    if (interpreterFrame)
                    {
                        Assert(!hasInlineeToBox);
                        frameKind = walker.IsBailedOutFromInlinee()? _u("Interpreted from Inlined Bailout (Pending)") :
                            walker.IsBailedOutFromFunction()? _u("Interpreted from Bailout") : _u("Interpreted");
                    }
                    else if (walker.IsInlineFrame())
                    {
                        Assert(this->NeedBoxFrame(callerFunctionBody));
                        frameKind = _u("Native Inlined (Pending)");
                    }
                    else if (this->NeedBoxFrame(callerFunctionBody))
                    {
                        frameKind = (hasInlineeToBox? _u("Native and Inlinee") : _u("Native"));
                    }
                    else
                    {
                        frameKind = _u("Native for Inlinee");
                    }

                    PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, callerFunctionBody,
                        _u("Boxing Frame [%s]: %s %s\n"), frameKind,
                        callerFunctionBody->GetDisplayName(), callerFunctionBody->GetDebugNumberSet(debugStringBuffer));
                }
#endif

                if (interpreterFrame)
                {
                    Assert(!hasInlineeToBox);

                    Assert(StackScriptFunction::GetCurrentFunctionObject(interpreterFrame->GetJavascriptFunction()) == caller);

                    if (callerFunctionBody->DoStackFrameDisplay() && interpreterFrame->IsClosureInitDone())
                    {
                        Js::FrameDisplay *stackFrameDisplay = interpreterFrame->GetLocalFrameDisplay();
                        // Local frame display may be null if bailout didn't restore it, which means we don't need it.
                        if (stackFrameDisplay)
                        {
                            Js::FrameDisplay *boxedFrameDisplay = this->BoxFrameDisplay(stackFrameDisplay);
                            interpreterFrame->SetLocalFrameDisplay(boxedFrameDisplay);
                        }
                    }
                    if (callerFunctionBody->DoStackScopeSlots() && interpreterFrame->IsClosureInitDone())
                    {
                        Field(Var)* stackScopeSlots = (Field(Var)*)interpreterFrame->GetLocalClosure();
                        if (stackScopeSlots)
                        {
                            // Scope slot pointer may be null if bailout didn't restore it, which means we don't need it.
                            Field(Var)* boxedScopeSlots = this->BoxScopeSlots(stackScopeSlots, static_cast<uint>(ScopeSlots(stackScopeSlots).GetCount()));
                            interpreterFrame->SetLocalClosure(boxedScopeSlots);
                        }
                    }

                    uint nestedCount = callerFunctionBody->GetNestedCount();
                    for (uint i = 0; i < nestedCount; i++)
                    {
                        // Box the stack function, even if they might not be "created" in the byte code yet.
                        // Some of them will not be captured in slots, so we just need to box them and record it with the
                        // stack func so that when we can just use the boxed value when we need it.
                        StackScriptFunction * stackFunction = interpreterFrame->GetStackNestedFunction(i);
                        ScriptFunction * boxedFunction = this->BoxStackFunction(stackFunction);
                        Assert(stackFunction->boxedScriptFunction == boxedFunction);
                        this->UpdateFrameDisplay(stackFunction);
                    }

                    if (walker.IsBailedOutFromInlinee())
                    {
                        if (!walker.IsCurrentPhysicalFrameForLoopBody())
                        {
                            // this is the interpret frame from bailing out of inline frame
                            // Just mark we have inlinee to box so we will walk the native frame's list when we get there.
                            hasInlineeToBox = true;
                        }
                    }
                    else if (walker.IsBailedOutFromFunction())
                    {
                        // The current interpret frame is from bailing out of a native frame.
                        // Walk native frame that was bailed out as well.
                        // The stack walker is pointing to the native frame already.
                        this->BoxNativeFrame(walker, callerFunctionBody);

                        // We don't need to box this frame, but we may still need to box the scope slot references
                        // within nested frame displays if the slots they refer to have been boxed.
                        if (callerFunctionBody->GetNestedCount() != 0)
                        {
                            this->ForEachStackNestedFunctionNative(walker, callerFunctionBody, [&](ScriptFunction *nestedFunc)
                            {
                                this->UpdateFrameDisplay(nestedFunc);
                            });
                        }
                    }
                }
                else
                {
                    if (walker.IsInlineFrame())
                    {
                        if (!walker.IsCurrentPhysicalFrameForLoopBody())
                        {
                            // We may have function that are not in slots.  So we have to walk the stack function list of the inliner
                            // to box all the needed function to catch those
                            hasInlineeToBox = true;
                        }
                    }
                    else
                    {
                        hasInlineeToBox = false;

                        if (callerFunctionBody->DoStackFrameDisplay())
                        {
                            Js::FrameDisplay *stackFrameDisplay =
                                this->GetFrameDisplayFromNativeFrame(walker, callerFunctionBody);
                            // Local frame display may be null if bailout didn't restore it, which means we don't need it.
                            if (stackFrameDisplay)
                            {
                                this->BoxFrameDisplay(stackFrameDisplay);
                            }
                        }
                        if (callerFunctionBody->DoStackScopeSlots())
                        {
                            Field(Var)* stackScopeSlots = (Field(Var)*)this->GetScopeSlotsFromNativeFrame(walker, callerFunctionBody);
                            if (stackScopeSlots)
                            {
                                // Scope slot pointer may be null if bailout didn't restore it, which means we don't need it.
                                this->BoxScopeSlots(stackScopeSlots, static_cast<uint>(ScopeSlots(stackScopeSlots).GetCount()));
                            }
                        }

                        // walk native frame
                        this->BoxNativeFrame(walker, callerFunctionBody);

                        // We don't need to box this frame, but we may still need to box the scope slot references
                        // within nested frame displays if the slots they refer to have been boxed.
                        if (callerFunctionBody->GetNestedCount() != 0)
                        {
                            this->ForEachStackNestedFunctionNative(walker, callerFunctionBody, [&](ScriptFunction *nestedFunc)
                            {
                                this->UpdateFrameDisplay(nestedFunc);
                            });
                        }
                    }
                }
            }
            else if (callerFunctionBody->DoStackFrameDisplay() && !walker.IsInlineFrame())
            {
                // The case here is that a frame need not be boxed, but the closure environment in that frame
                // refers to an outer boxed frame.
                // Find the FD and walk it looking for a slot array that refers to a FB that must be boxed.
                // Everything from that point outward must be boxed.
                FrameDisplay *frameDisplay;
                InterpreterStackFrame *interpreterFrame = walker.GetCurrentInterpreterFrame();
                bool closureInitDone = true; // Set to true as for native frame bailout will always restore the frameDisplay but for interpreter frame if PROBE_STACK fails closureInitDone won't have completed.

                if (interpreterFrame)
                {
                    frameDisplay = interpreterFrame->GetLocalFrameDisplay();
                    closureInitDone = interpreterFrame->IsClosureInitDone();
                }
                else
                {
                    frameDisplay = (Js::FrameDisplay*)walker.GetCurrentArgv()[
#if _M_IX86 || _M_AMD64
                        callerFunctionBody->GetInParamsCount() == 0 ?
                        JavascriptFunctionArgIndex_StackFrameDisplayNoArg :
#endif
                        JavascriptFunctionArgIndex_StackFrameDisplay];
                }
                if (ThreadContext::IsOnStack(frameDisplay) && closureInitDone)
                {
                    int i;
                    for (i = 0; i < frameDisplay->GetLength(); i++)
                    {
                        Field(Var) *slotArray = (Field(Var)*)frameDisplay->GetItem(i);

                        if (ScopeSlots::Is(slotArray))
                        {
                            ScopeSlots slots(slotArray);
                            if (!slots.IsDebuggerScopeSlotArray())
                            {
                                FunctionProxy *functionProxy = slots.GetFunctionInfo()->GetFunctionProxy();
                                if (functionProxy->IsFunctionBody() && this->NeedBoxFrame(functionProxy->GetFunctionBody()))
                                {
                                    break;
                                }
                            }
                        }
                    }
                    for (; i < frameDisplay->GetLength(); i++)
                    {
                        Field(Var) *pScope = (Field(Var)*)frameDisplay->GetItem(i);
                        if (ScopeSlots::Is(pScope))
                        {
                            Field(Var) *boxedSlots = this->BoxScopeSlots(pScope, static_cast<uint>(ScopeSlots(pScope).GetCount()));
                            frameDisplay->SetItem(i, boxedSlots);
                        }
                    }
                }
            }

            ScriptFunction * boxedCaller = nullptr;
            if (this->NeedBoxScriptFunction(callerScriptFunction))
            {
                // TODO-STACK-NESTED-FUNC: Can't assert this yet, JIT might not do stack func allocation
                // if the function hasn't been parsed or deserialized yet.
                // Assert(ThreadContext::IsOnStack(callerScriptFunction));
                if (ThreadContext::IsOnStack(callerScriptFunction))
                {
                    boxedCaller = this->BoxStackFunction(VarTo<StackScriptFunction>(callerScriptFunction));
                    walker.SetCurrentFunction(boxedCaller);

                    InterpreterStackFrame * interpreterFrame = walker.GetCurrentInterpreterFrame();
                    if (interpreterFrame)
                    {
                        interpreterFrame->SetExecutingStackFunction(boxedCaller);
                    }

                    // We don't need to box this frame, but we may still need to box the scope slot references
                    // within nested frame displays if the slots they refer to have been boxed.
                    if (callerFunctionBody->GetNestedCount() != 0)
                    {
                        this->ForEachStackNestedFunction(walker, callerFunctionBody, [&](ScriptFunction *nestedFunc)
                        {
                            this->UpdateFrameDisplay(nestedFunc);
                        });
                    }
                }
            }
        }

        Assert(!hasInlineeToBox);

        // We have to find one nested function
        this->Finish();
    }